

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O0

int mdb_env_cwalk(mdb_copy *my,pgno_t *pg,int flags)

{
  MDB_page *pMVar1;
  pgno_t pg_2;
  MDB_db db;
  pgno_t pg_1;
  MDB_page *omp;
  uint n;
  uint i;
  int toggle;
  int rc;
  char *ptr;
  char *buf;
  MDB_page *leaf;
  MDB_page *mp;
  MDB_page *mo;
  MDB_node *ni;
  MDB_cursor mc;
  int flags_local;
  pgno_t *pg_local;
  mdb_copy *my_local;
  
  if (*pg == 0xffffffffffffffff) {
    my_local._4_4_ = 0;
  }
  else {
    mc.mc_dbflag._0_2_ = 1;
    mc.mc_dbflag._2_2_ = 0;
    mc.mc_xcursor = (MDB_xcursor *)my->mc_txn;
    mc.mc_ki._60_4_ = flags;
    i = mdb_page_get((MDB_cursor *)&ni,*pg,(MDB_page **)&mc.mc_snum,(int *)0x0);
    my_local._4_4_ = i;
    if ((i == 0) &&
       (i = mdb_page_search_root((MDB_cursor *)&ni,(MDB_val *)0x0,4), my_local._4_4_ = i, i == 0)) {
      _toggle = (MDB_page *)malloc((ulong)(my->mc_env->me_psize * (uint)(ushort)mc.mc_dbflag));
      if (_toggle == (MDB_page *)0x0) {
        my_local._4_4_ = 0xc;
      }
      else {
        ptr = (char *)_toggle;
        for (omp._4_4_ = 0; omp._4_4_ < mc.mc_dbflag._2_2_; omp._4_4_ = omp._4_4_ + 1) {
          mdb_page_copy(_toggle,mc.mc_pg[(ulong)omp._4_4_ - 1],my->mc_env->me_psize);
          mc.mc_pg[(ulong)omp._4_4_ - 1] = _toggle;
          _toggle = (MDB_page *)((long)_toggle->mp_ptrs + ((ulong)my->mc_env->me_psize - 0x10));
        }
        buf = (char *)_toggle;
        n = my->mc_toggle;
        while ((ushort)mc.mc_dbflag != 0) {
          leaf = mc.mc_pg[(ulong)mc.mc_dbflag._2_2_ - 1];
          omp._0_4_ = (leaf->mp_pb).pb.pb_lower - 0x10 >> 1;
          if ((leaf->mp_flags & 2) == 2) {
            if (((leaf->mp_flags & 0x20) != 0x20) && ((mc.mc_ki._60_4_ & 4) == 0)) {
              for (omp._4_4_ = 0; omp._4_4_ < (uint)omp; omp._4_4_ = omp._4_4_ + 1) {
                mo = (MDB_page *)
                     ((long)leaf->mp_ptrs + (long)(int)(uint)leaf->mp_ptrs[omp._4_4_] + -0x10);
                if (((mo->mp_p).p_pgno & 0x100000000) == 0) {
                  if (((mo->mp_p).p_pgno & 0x200000000) != 0) {
                    if (leaf != (MDB_page *)buf) {
                      mc.mc_pg[(ulong)mc.mc_dbflag._2_2_ - 1] = (MDB_page *)buf;
                      mdb_page_copy((MDB_page *)buf,leaf,my->mc_env->me_psize);
                      leaf = (MDB_page *)buf;
                      mo = (MDB_page *)
                           (buf + (int)(uint)*(ushort *)(buf + (ulong)omp._4_4_ * 2 + 0x10));
                    }
                    memcpy(&pg_2,(void *)((long)mo->mp_ptrs +
                                         (long)(int)(uint)*(ushort *)((long)&mo->mp_p + 6) + -8),
                           0x30);
                    my->mc_toggle = n;
                    i = mdb_env_cwalk(my,&db.md_entries,*(ushort *)((long)&mo->mp_p + 4) & 4);
                    if (i != 0) goto LAB_0011a35d;
                    n = my->mc_toggle;
                    memcpy((void *)((long)mo->mp_ptrs +
                                   (long)(int)(uint)*(ushort *)((long)&mo->mp_p + 6) + -8),&pg_2,
                           0x30);
                  }
                }
                else {
                  if (leaf != (MDB_page *)buf) {
                    mc.mc_pg[(ulong)mc.mc_dbflag._2_2_ - 1] = (MDB_page *)buf;
                    mdb_page_copy((MDB_page *)buf,leaf,my->mc_env->me_psize);
                    leaf = (MDB_page *)buf;
                    mo = (MDB_page *)
                         (buf + (int)(uint)*(ushort *)(buf + (ulong)omp._4_4_ * 2 + 0x10));
                  }
                  db.md_root = *(pgno_t *)
                                ((long)mo->mp_ptrs +
                                (long)(int)(uint)*(ushort *)((long)&mo->mp_p + 6) + -8);
                  i = mdb_page_get((MDB_cursor *)&ni,db.md_root,(MDB_page **)&pg_1,(int *)0x0);
                  if (i != 0) goto LAB_0011a35d;
                  if (0xfffff < my->mc_wlen[(int)n]) {
                    i = mdb_env_cthr_toggle(my,1);
                    if (i != 0) goto LAB_0011a35d;
                    n = my->mc_toggle;
                  }
                  mp = (MDB_page *)(my->mc_wbuf[(int)n] + my->mc_wlen[(int)n]);
                  memcpy(mp,(void *)pg_1,(ulong)my->mc_env->me_psize);
                  mp->mp_p = (anon_union_8_2_b62042e6_for_mp_p)my->mc_next_pgno;
                  my->mc_next_pgno = (ulong)*(uint *)(pg_1 + 0xc) + my->mc_next_pgno;
                  my->mc_wlen[(int)n] = my->mc_env->me_psize + my->mc_wlen[(int)n];
                  if (1 < *(uint *)(pg_1 + 0xc)) {
                    my->mc_olen[(int)n] = my->mc_env->me_psize * (*(int *)(pg_1 + 0xc) + -1);
                    my->mc_over[(int)n] = (char *)(pg_1 + my->mc_env->me_psize);
                    i = mdb_env_cthr_toggle(my,1);
                    if (i != 0) goto LAB_0011a35d;
                    n = my->mc_toggle;
                  }
                  *(anon_union_8_2_b62042e6_for_mp_p *)
                   ((long)mo->mp_ptrs + (long)(int)(uint)*(ushort *)((long)&mo->mp_p + 6) + -8) =
                       mp->mp_p;
                }
              }
            }
LAB_0011a1a9:
            if (0xfffff < my->mc_wlen[(int)n]) {
              i = mdb_env_cthr_toggle(my,1);
              if (i != 0) break;
              n = my->mc_toggle;
            }
            mp = (MDB_page *)(my->mc_wbuf[(int)n] + my->mc_wlen[(int)n]);
            mdb_page_copy(mp,leaf,my->mc_env->me_psize);
            pMVar1 = (MDB_page *)my->mc_next_pgno;
            my->mc_next_pgno = (pgno_t)((long)&pMVar1->mp_p + 1);
            (mp->mp_p).p_next = pMVar1;
            my->mc_wlen[(int)n] = my->mc_env->me_psize + my->mc_wlen[(int)n];
            if (mc.mc_dbflag._2_2_ == 0) {
              *pg = (pgno_t)mp->mp_p;
              break;
            }
            mo = (MDB_page *)
                 ((long)mc.mc_pg[(long)(int)(mc.mc_dbflag._2_2_ - 1) + -1]->mp_ptrs +
                 (long)(int)(uint)mc.mc_pg[(long)(int)(mc.mc_dbflag._2_2_ - 1) + -1]->mp_ptrs
                                  [mc.mc_ki[(long)(int)(mc.mc_dbflag._2_2_ - 1) + -4]] + -0x10);
            *(short *)&mo->mp_p = (short)(mp->mp_p).p_pgno;
            *(short *)((long)&mo->mp_p + 2) = (short)((mp->mp_p).p_pgno >> 0x10);
            *(short *)((long)&mo->mp_p + 4) = (short)((mp->mp_p).p_pgno >> 0x20);
            mdb_cursor_pop((MDB_cursor *)&ni);
          }
          else {
            mc.mc_ki[(ulong)mc.mc_dbflag._2_2_ - 4] = mc.mc_ki[(ulong)mc.mc_dbflag._2_2_ - 4] + 1;
            if ((uint)omp <= mc.mc_ki[(ulong)mc.mc_dbflag._2_2_ - 4]) goto LAB_0011a1a9;
            while( true ) {
              mo = (MDB_page *)
                   ((long)leaf->mp_ptrs +
                   (long)(int)(uint)leaf->mp_ptrs[mc.mc_ki[(ulong)mc.mc_dbflag._2_2_ - 4]] + -0x10);
              i = mdb_page_get((MDB_cursor *)&ni,(ulong)*(uint6 *)&mo->mp_p,&leaf,(int *)0x0);
              if (i != 0) goto LAB_0011a35d;
              mc.mc_dbflag._2_2_ = mc.mc_dbflag._2_2_ + 1;
              mc.mc_dbflag._0_2_ = (ushort)mc.mc_dbflag + 1;
              mc.mc_ki[(ulong)mc.mc_dbflag._2_2_ - 4] = 0;
              if ((leaf->mp_flags & 1) != 1) break;
              mdb_page_copy(mc.mc_pg[(ulong)mc.mc_dbflag._2_2_ - 1],leaf,my->mc_env->me_psize);
            }
            mc.mc_pg[(ulong)mc.mc_dbflag._2_2_ - 1] = leaf;
          }
        }
LAB_0011a35d:
        free(ptr);
        my_local._4_4_ = i;
      }
    }
  }
  return my_local._4_4_;
}

Assistant:

static int ESECT
mdb_env_cwalk(mdb_copy *my, pgno_t *pg, int flags)
{
	MDB_cursor mc;
	MDB_node *ni;
	MDB_page *mo, *mp, *leaf;
	char *buf, *ptr;
	int rc, toggle;
	unsigned int i;

	/* Empty DB, nothing to do */
	if (*pg == P_INVALID)
		return MDB_SUCCESS;

	mc.mc_snum = 1;
	mc.mc_top = 0;
	mc.mc_txn = my->mc_txn;

	rc = mdb_page_get(&mc, *pg, &mc.mc_pg[0], NULL);
	if (rc)
		return rc;
	rc = mdb_page_search_root(&mc, NULL, MDB_PS_FIRST);
	if (rc)
		return rc;

	/* Make cursor pages writable */
	buf = ptr = malloc(my->mc_env->me_psize * mc.mc_snum);
	if (buf == NULL)
		return ENOMEM;

	for (i=0; i<mc.mc_top; i++) {
		mdb_page_copy((MDB_page *)ptr, mc.mc_pg[i], my->mc_env->me_psize);
		mc.mc_pg[i] = (MDB_page *)ptr;
		ptr += my->mc_env->me_psize;
	}

	/* This is writable space for a leaf page. Usually not needed. */
	leaf = (MDB_page *)ptr;

	toggle = my->mc_toggle;
	while (mc.mc_snum > 0) {
		unsigned n;
		mp = mc.mc_pg[mc.mc_top];
		n = NUMKEYS(mp);

		if (IS_LEAF(mp)) {
			if (!IS_LEAF2(mp) && !(flags & F_DUPDATA)) {
				for (i=0; i<n; i++) {
					ni = NODEPTR(mp, i);
					if (ni->mn_flags & F_BIGDATA) {
						MDB_page *omp;
						pgno_t pg;

						/* Need writable leaf */
						if (mp != leaf) {
							mc.mc_pg[mc.mc_top] = leaf;
							mdb_page_copy(leaf, mp, my->mc_env->me_psize);
							mp = leaf;
							ni = NODEPTR(mp, i);
						}

						memcpy(&pg, NODEDATA(ni), sizeof(pg));
						rc = mdb_page_get(&mc, pg, &omp, NULL);
						if (rc)
							goto done;
						if (my->mc_wlen[toggle] >= MDB_WBUF) {
							rc = mdb_env_cthr_toggle(my, 1);
							if (rc)
								goto done;
							toggle = my->mc_toggle;
						}
						mo = (MDB_page *)(my->mc_wbuf[toggle] + my->mc_wlen[toggle]);
						memcpy(mo, omp, my->mc_env->me_psize);
						mo->mp_pgno = my->mc_next_pgno;
						my->mc_next_pgno += omp->mp_pages;
						my->mc_wlen[toggle] += my->mc_env->me_psize;
						if (omp->mp_pages > 1) {
							my->mc_olen[toggle] = my->mc_env->me_psize * (omp->mp_pages - 1);
							my->mc_over[toggle] = (char *)omp + my->mc_env->me_psize;
							rc = mdb_env_cthr_toggle(my, 1);
							if (rc)
								goto done;
							toggle = my->mc_toggle;
						}
						memcpy(NODEDATA(ni), &mo->mp_pgno, sizeof(pgno_t));
					} else if (ni->mn_flags & F_SUBDATA) {
						MDB_db db;

						/* Need writable leaf */
						if (mp != leaf) {
							mc.mc_pg[mc.mc_top] = leaf;
							mdb_page_copy(leaf, mp, my->mc_env->me_psize);
							mp = leaf;
							ni = NODEPTR(mp, i);
						}

						memcpy(&db, NODEDATA(ni), sizeof(db));
						my->mc_toggle = toggle;
						rc = mdb_env_cwalk(my, &db.md_root, ni->mn_flags & F_DUPDATA);
						if (rc)
							goto done;
						toggle = my->mc_toggle;
						memcpy(NODEDATA(ni), &db, sizeof(db));
					}
				}
			}
		} else {
			mc.mc_ki[mc.mc_top]++;
			if (mc.mc_ki[mc.mc_top] < n) {
				pgno_t pg;
again:
				ni = NODEPTR(mp, mc.mc_ki[mc.mc_top]);
				pg = NODEPGNO(ni);
				rc = mdb_page_get(&mc, pg, &mp, NULL);
				if (rc)
					goto done;
				mc.mc_top++;
				mc.mc_snum++;
				mc.mc_ki[mc.mc_top] = 0;
				if (IS_BRANCH(mp)) {
					/* Whenever we advance to a sibling branch page,
					 * we must proceed all the way down to its first leaf.
					 */
					mdb_page_copy(mc.mc_pg[mc.mc_top], mp, my->mc_env->me_psize);
					goto again;
				} else
					mc.mc_pg[mc.mc_top] = mp;
				continue;
			}
		}
		if (my->mc_wlen[toggle] >= MDB_WBUF) {
			rc = mdb_env_cthr_toggle(my, 1);
			if (rc)
				goto done;
			toggle = my->mc_toggle;
		}
		mo = (MDB_page *)(my->mc_wbuf[toggle] + my->mc_wlen[toggle]);
		mdb_page_copy(mo, mp, my->mc_env->me_psize);
		mo->mp_pgno = my->mc_next_pgno++;
		my->mc_wlen[toggle] += my->mc_env->me_psize;
		if (mc.mc_top) {
			/* Update parent if there is one */
			ni = NODEPTR(mc.mc_pg[mc.mc_top-1], mc.mc_ki[mc.mc_top-1]);
			SETPGNO(ni, mo->mp_pgno);
			mdb_cursor_pop(&mc);
		} else {
			/* Otherwise we're done */
			*pg = mo->mp_pgno;
			break;
		}
	}
done:
	free(buf);
	return rc;
}